

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexStats.cpp
# Opt level: O1

void __thiscall UnifiedRegex::RegexStatsDatabase::Print(RegexStatsDatabase *this,DebugWriter *w)

{
  RegexStats **ppRVar1;
  RegexStatsMap *pRVar2;
  int iVar3;
  undefined1 local_a8 [8];
  RegexStats totals;
  
  iVar3 = 0;
  RegexStats::RegexStats((RegexStats *)local_a8,(RegexPattern *)0x0);
  Output::Print(L"Regular Expression Statistics\n");
  Output::Print(L"=============================\n");
  pRVar2 = this->map;
  if (0 < pRVar2->count - pRVar2->freeCount) {
    do {
      ppRVar1 = JsUtil::
                BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                ::GetValueAt(pRVar2,iVar3);
      RegexStats::Add((RegexStats *)local_a8,*ppRVar1);
      iVar3 = iVar3 + 1;
      pRVar2 = this->map;
    } while (iVar3 < pRVar2->count - pRVar2->freeCount);
  }
  pRVar2 = this->map;
  if (0 < pRVar2->count - pRVar2->freeCount) {
    iVar3 = 0;
    do {
      ppRVar1 = JsUtil::
                BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                ::GetValueAt(pRVar2,iVar3);
      RegexStats::Print(*ppRVar1,w,(RegexStats *)local_a8,this->ticksPerMillisecond);
      iVar3 = iVar3 + 1;
      pRVar2 = this->map;
    } while (iVar3 < pRVar2->count - pRVar2->freeCount);
  }
  RegexStats::Print((RegexStats *)local_a8,w,(RegexStats *)0x0,this->ticksPerMillisecond);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&this->allocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,w,0x1008);
  return;
}

Assistant:

void RegexStatsDatabase::Print(DebugWriter* w)
    {
        RegexStats totals(0);

        Output::Print(_u("Regular Expression Statistics\n"));
        Output::Print(_u("=============================\n"));

        for (int i = 0; i < map->Count(); i++)
            totals.Add(map->GetValueAt(i));

        for (int i = 0; i < map->Count(); i++)
            map->GetValueAt(i)->Print(w, &totals, ticksPerMillisecond);

        totals.Print(w, 0, ticksPerMillisecond);

        allocator->Free(w, sizeof(DebugWriter));
    }